

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_end(Context *ctx)

{
  RegisterList *pRVar1;
  
  if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 2)) {
    pRVar1 = reglist_insert(ctx,&ctx->used_registers,REG_TYPE_COLOROUT,0);
    if (pRVar1 != (RegisterList *)0x0) {
      pRVar1->written = 1;
    }
    output_line(ctx,"oC0 = r0;");
  }
  if (ctx->previous_opcode == 0x1c) {
    return;
  }
  emit_METAL_RET(ctx);
  return;
}

Assistant:

static void emit_METAL_end(Context *ctx)
{
    // !!! FIXME: maybe handle this at a higher level?
    // ps_1_* writes color to r0 instead oC0. We move it to the right place.
    // We don't have to worry about a RET opcode messing this up, since
        //  RET isn't available before ps_2_0.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        set_used_register(ctx, REG_TYPE_COLOROUT, 0, 1);
        output_line(ctx, "oC0 = r0;");
    } // if

    // !!! FIXME: maybe handle this at a higher level?
    // force a RET opcode if we're at the end of the stream without one.
    if (ctx->previous_opcode != OPCODE_RET)
        emit_METAL_RET(ctx);
}